

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O0

void __thiscall CompoundFile::Stream::seek(Stream *this,int32_t pos,SeekType type)

{
  long lVar1;
  int32_t iVar2;
  int32_t iVar3;
  reference pvVar4;
  size_t sVar5;
  reference pvVar6;
  streamoff sVar7;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  streampos pos_1;
  int32_t offsetInLargeSector;
  SecID largeSector;
  SecID shortSector;
  int32_t sectorIdx;
  int32_t offset;
  size_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SecID *in_stack_ffffffffffffff90;
  char *pcVar8;
  SecID *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  fpos local_38 [20];
  int32_t local_24;
  SecID local_20;
  int32_t local_1c;
  int local_18;
  int local_14;
  int local_c;
  
  if (in_EDX == 1) {
    local_c = *(int *)(in_RDI + 0x54) + in_ESI;
    if (local_c < 0) {
      local_c = *(int *)(in_RDI + 0x68) + local_c;
    }
  }
  else if ((in_EDX == 2) && (0 < in_ESI)) {
    local_c = *(int *)(in_RDI + 0x68) - in_ESI;
  }
  else if ((in_EDX == 2) && (in_ESI < 0)) {
    local_c = in_ESI;
    if (in_ESI < 1) {
      local_c = -in_ESI;
    }
  }
  else {
    local_c = in_ESI;
    if ((in_EDX == 0) && (local_c = in_ESI, in_ESI < 0)) {
      local_c = *(int *)(in_RDI + 0x68) - in_ESI;
    }
  }
  if (local_c < *(int *)(in_RDI + 0x68)) {
    local_14 = local_c % *(int *)(in_RDI + 0x58);
    local_18 = local_c / *(int *)(in_RDI + 0x58);
    *(int *)(in_RDI + 0x54) = local_c;
    *(int *)(in_RDI + 0x5c) = local_14;
    if (*(int *)(in_RDI + 0x50) == 0) {
      *(int *)(in_RDI + 100) = local_18;
      iVar2 = SecID::operator_cast_to_int((SecID *)(in_RDI + 0x8c));
      pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                         ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      iVar3 = SecID::operator_cast_to_int(pvVar4);
      if (iVar2 != iVar3) {
        pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                           ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78);
        *(int32_t *)(in_RDI + 0x8c) = pvVar4->m_id;
        lVar1 = *(long *)(in_RDI + 0x48);
        std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                  ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        sVar5 = calcFileOffset((SecID *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                ),in_stack_ffffffffffffff78);
        std::istream::seekg(lVar1,(_Ios_Seekdir)sVar5);
        pcVar8 = *(char **)(in_RDI + 0x48);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x70),0);
        std::istream::read(pcVar8,(long)pvVar6);
      }
      *(int *)(in_RDI + 0x88) = local_14;
    }
    else {
      pvVar4 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                         ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
      local_1c = pvVar4->m_id;
      SecID::SecID(&local_20);
      local_24 = whereIsShortSector((Stream *)
                                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                    in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      *(int *)(in_RDI + 0x60) = local_18;
      iVar2 = SecID::operator_cast_to_int((SecID *)(in_RDI + 0x8c));
      iVar3 = SecID::operator_cast_to_int(&local_20);
      if (iVar2 != iVar3) {
        *(int32_t *)(in_RDI + 0x8c) = local_20.m_id;
        Header::sectorSize(*(Header **)(in_RDI + 0x10));
        calcFileOffset((SecID *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
        std::fpos<__mbstate_t>::fpos
                  ((fpos<__mbstate_t> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        lVar1 = *(long *)(in_RDI + 0x48);
        sVar7 = std::fpos::operator_cast_to_long(local_38);
        std::istream::seekg(lVar1,(_Ios_Seekdir)sVar7);
        pcVar8 = *(char **)(in_RDI + 0x48);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x70),0);
        Header::sectorSize(*(Header **)(in_RDI + 0x10));
        std::istream::read(pcVar8,(long)pvVar6);
      }
      iVar2 = Header::shortSectorSize(*(Header **)(in_RDI + 0x10));
      *(int32_t *)(in_RDI + 0x88) = local_24 * iVar2;
      *(int *)(in_RDI + 0x88) = local_14 + *(int *)(in_RDI + 0x88);
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_RDI + 0x68);
  }
  return;
}

Assistant:

inline void
Stream::seek( int32_t pos, SeekType type )
{
	if( type == FromCurrent )
	{
		pos += m_bytesReaded;

		if( pos < 0 )
			pos += m_streamSize;
	}
	else if( type == FromEnd && pos > 0 )
		pos = m_streamSize - pos;
	else if( type == FromEnd && pos < 0 )
		pos = std::abs( pos );
	else if( type == FromBeginning && pos < 0 )
		pos = m_streamSize - pos;

	if( pos >= m_streamSize )
	{
		m_bytesReaded = m_streamSize;
		return;
	}

	const int32_t offset = pos % m_sectorSize;
	const int32_t sectorIdx = pos / m_sectorSize;

	m_bytesReaded = pos;
	m_sectorBytesReaded = offset;

	if( m_mode == LargeStream )
	{
		m_largeSecIDIdx = sectorIdx;

		if( m_currentLargeSectorID != m_largeStreamChain.at( m_largeSecIDIdx ) )
		{
			m_currentLargeSectorID = m_largeStreamChain.at( m_largeSecIDIdx );

			m_stream.seekg( calcFileOffset( m_largeStreamChain.at( m_largeSecIDIdx ),
				m_sectorSize ), std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_sectorSize );
		}

		m_pos = offset;
	}
	else
	{
		const SecID shortSector = m_shortStreamChain.at( sectorIdx );

		SecID largeSector;
		const int32_t offsetInLargeSector = whereIsShortSector( shortSector,
			largeSector );

		m_shortSecIDIdx = sectorIdx;

		if( m_currentLargeSectorID != largeSector )
		{
			m_currentLargeSectorID = largeSector;

			std::streampos pos = calcFileOffset( largeSector,
				m_header.sectorSize() );

			m_stream.seekg( pos, std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_header.sectorSize() );
		}

		m_pos = offsetInLargeSector * m_header.shortSectorSize();
		m_pos += offset;
	}
}